

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O2

void CTestGen12dGPUResource::SetUpTestCase(void)

{
  ADAPTER_INFO *pAVar1;
  
  puts("SetUpTestCase");
  CommonULT::GfxPlatform.eProductFamily = IGFX_XE_HP_SDV;
  CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_XE_HP_CORE;
  pAVar1 = (ADAPTER_INFO *)calloc(1,0x9bf);
  CommonULT::pGfxAdapterInfo = pAVar1;
  if (pAVar1 != (ADAPTER_INFO *)0x0) {
    *(undefined2 *)&(pAVar1->SkuTable).field_0 = 0x40;
    (pAVar1->SkuTable).field_1 = (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)0x100048000;
    CommonULT::SetUpTestCase();
    return;
  }
  return;
}

Assistant:

void CTestGen12dGPUResource::SetUpTestCase()
{
    printf("%s\n", __FUNCTION__);
    GfxPlatform.eProductFamily    = IGFX_XE_HP_SDV;
    GfxPlatform.eRenderCoreFamily = IGFX_XE_HP_CORE;

    pGfxAdapterInfo = (ADAPTER_INFO *)malloc(sizeof(ADAPTER_INFO));
    if(pGfxAdapterInfo)
    {
        memset(pGfxAdapterInfo, 0, sizeof(ADAPTER_INFO));

        pGfxAdapterInfo->SkuTable.FtrLinearCCS             = 1; //legacy y =>0 - test both
        pGfxAdapterInfo->SkuTable.FtrStandardMipTailFormat = 1;
        pGfxAdapterInfo->SkuTable.FtrTileY                 = 1;
        pGfxAdapterInfo->SkuTable.FtrTile64Optimization    = 1;
	CommonULT::SetUpTestCase();
    }
}